

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.c
# Opt level: O2

int spec_code(void *new_ps,void **children,int n_children,int pn_offset,D_Parser *parser)

{
  return 0;
}

Assistant:

int spec_code(void *new_ps, void **children, int n_children, int pn_offset, struct D_Parser *parser) {
  (void)new_ps;
  (void)children;
  (void)n_children;
  (void)pn_offset;
  (void)parser;
  return 0;
}